

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupTrimmed(Gia_Man_t *p,int fTrimCis,int fTrimCos,int fDualOut,int OutValue)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  iVar7 = 0;
  if (fTrimCos == 0 || fDualOut == 0) {
    p_00 = (Vec_Int_t *)0x0;
  }
  else {
    p_00 = Gia_ManDupTrimmedNonZero(p);
  }
  p_01 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  Gia_ManCreateRefs(p);
  for (; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if ((fTrimCis == 0) || (pGVar5 == (Gia_Obj_t *)0x0)) break;
    iVar1 = Gia_ObjRefNum(p,pGVar5);
    if (iVar1 != 0) break;
  }
  if (p->vCis->nSize - p->nRegs == iVar7) {
    Gia_ManAppendCi(p_01);
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if (fTrimCis == 0) {
LAB_001d9203:
      uVar2 = Gia_ManAppendCi(p_01);
      pGVar5->Value = uVar2;
    }
    else {
      iVar1 = Gia_ObjRefNum(p,pGVar5);
      if (iVar1 != 0) goto LAB_001d9203;
      iVar1 = Gia_ObjIsRo(p,pGVar5);
      if (iVar1 != 0) goto LAB_001d9203;
    }
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar2 = Gia_ManAppendAnd(p_01,iVar1,iVar3);
      pGVar5->Value = uVar2;
    }
  }
  if (fTrimCos == 0 || fDualOut == 0) {
    for (iVar7 = 0; iVar7 < p->vCos->nSize - p->nRegs; iVar7 = iVar7 + 1) {
      pGVar6 = p;
      pGVar5 = Gia_ManCo(p,iVar7);
      if ((fTrimCos == 0) || (pGVar5 == (Gia_Obj_t *)0x0)) break;
      iVar1 = Gia_ManPoIsToRemove(pGVar6,pGVar5,OutValue);
      if (iVar1 == 0) break;
    }
    if (p->vCos->nSize - p->nRegs == iVar7) {
      Gia_ManAppendCo(p_01,0);
    }
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pGVar6 = p;
      pGVar5 = Gia_ManCo(p,iVar7);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      if (fTrimCos == 0) {
LAB_001d93cf:
        iVar1 = Gia_ObjFanin0Copy(pGVar5);
        Gia_ManAppendCo(p_01,iVar1);
      }
      else {
        iVar1 = Gia_ManPoIsToRemove(pGVar6,pGVar5,OutValue);
        if (iVar1 == 0) goto LAB_001d93cf;
        iVar1 = Gia_ObjIsRi(p,pGVar5);
        if (iVar1 != 0) goto LAB_001d93cf;
      }
    }
    Gia_ManSetRegNum(p_01,p->nRegs);
  }
  else {
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar7);
      pGVar5 = Gia_ManPo(p,iVar1 * 2);
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(p_01,iVar3);
      pGVar5 = Gia_ManPo(p,iVar1 * 2 + 1);
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(p_01,iVar1);
    }
    if (p_01->vCos->nSize == p_01->nRegs) {
      Gia_ManAppendCo(p_01,0);
      Gia_ManAppendCo(p_01,0);
    }
    for (iVar7 = 0; iVar1 = p->nRegs, iVar7 < iVar1; iVar7 = iVar7 + 1) {
      pGVar5 = Gia_ManCo(p,(p->vCos->nSize - iVar1) + iVar7);
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        iVar1 = p->nRegs;
        break;
      }
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(p_01,iVar1);
    }
    Gia_ManSetRegNum(p_01,iVar1);
    pGVar6 = Gia_ManSeqStructSweep(p_01,1,1,0);
    Gia_ManStop(p_01);
    p_01 = pGVar6;
  }
  if (p_00 != (Vec_Int_t *)0x0) {
    free(p_00->pArray);
    free(p_00);
  }
  iVar7 = Gia_ManHasDangling(p_01);
  if (iVar7 == 0) {
    return p_01;
  }
  __assert_fail("!Gia_ManHasDangling( pNew )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x8c2,"Gia_Man_t *Gia_ManDupTrimmed(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed( Gia_Man_t * p, int fTrimCis, int fTrimCos, int fDualOut, int OutValue )
{
    Vec_Int_t * vNonZero = NULL;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Entry;
    // collect non-zero
    if ( fDualOut && fTrimCos )
        vNonZero = Gia_ManDupTrimmedNonZero( p );
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fDualOut && fTrimCos )
    {
        Vec_IntForEachEntry( vNonZero, Entry, i )
        {
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+0)) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+1)) );
        }
        if ( Gia_ManPoNum(pNew) == 0 ) // nothing - add dummy PO
        {
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 0)) );
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 1)) );
            Gia_ManAppendCo( pNew, 0 );
            Gia_ManAppendCo( pNew, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // cleanup
        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 1, 1, 0 );
        Gia_ManStop( pTemp );
        // trim the PIs
//        pNew = Gia_ManDupTrimmed( pTemp = pNew, 1, 0, 0 );
//        Gia_ManStop( pTemp );
    }
    else
    {
        // check if there are POs to be added
        Gia_ManForEachPo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) )
                break;
        if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
            Gia_ManAppendCo( pNew, 0 );
        Gia_ManForEachCo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) || Gia_ObjIsRi(p, pObj) )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    }
    Vec_IntFreeP( &vNonZero );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}